

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.c
# Opt level: O0

void al_destroy_audio_recorder(ALLEGRO_AUDIO_RECORDER *r)

{
  ALLEGRO_AUDIO_RECORDER *in_RDI;
  size_t i;
  ulong local_10;
  
  if (in_RDI != (ALLEGRO_AUDIO_RECORDER *)0x0) {
    if (in_RDI->thread != (ALLEGRO_THREAD *)0x0) {
      al_set_thread_should_stop(in_RDI->thread);
      al_lock_mutex(in_RDI->mutex);
      in_RDI->is_recording = false;
      al_signal_cond(in_RDI->cond);
      al_unlock_mutex(in_RDI->mutex);
      al_join_thread(in_RDI->thread,0);
      al_destroy_thread(in_RDI->thread);
    }
    if (_al_kcm_driver->deallocate_recorder != (_func_void_ALLEGRO_AUDIO_RECORDER_ptr *)0x0) {
      (*_al_kcm_driver->deallocate_recorder)(in_RDI);
    }
    al_destroy_user_event_source(in_RDI);
    al_destroy_mutex(in_RDI->mutex);
    al_destroy_cond(in_RDI->cond);
    for (local_10 = 0; local_10 < in_RDI->fragment_count; local_10 = local_10 + 1) {
      al_free_with_context
                (in_RDI->fragments[local_10],0xab,
                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/recorder.c"
                 ,"al_destroy_audio_recorder");
    }
    al_free_with_context
              (in_RDI->fragments,0xad,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/recorder.c"
               ,"al_destroy_audio_recorder");
    al_free_with_context
              (in_RDI,0xae,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/recorder.c"
               ,"al_destroy_audio_recorder");
  }
  return;
}

Assistant:

void al_destroy_audio_recorder(ALLEGRO_AUDIO_RECORDER *r)
{
   size_t i;

   if (!r)
      return;

   if (r->thread) {
      al_set_thread_should_stop(r->thread);
      
      al_lock_mutex(r->mutex);
      r->is_recording = false;
      al_signal_cond(r->cond);
      al_unlock_mutex(r->mutex);
   
      al_join_thread(r->thread, NULL);
      al_destroy_thread(r->thread);
    }
   
   if (_al_kcm_driver->deallocate_recorder) {
      _al_kcm_driver->deallocate_recorder(r);
   }
   
   al_destroy_user_event_source(&r->source);     
   al_destroy_mutex(r->mutex);
   al_destroy_cond(r->cond);
   
   for (i = 0; i < r->fragment_count; ++i) {
      al_free(r->fragments[i]);
   }
   al_free(r->fragments);
   al_free(r);
}